

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

int __thiscall re2::Prog::first_byte(Prog *this)

{
  anon_class_8_1_8991fb9c local_18;
  Prog *local_10;
  Prog *this_local;
  
  local_18.this = this;
  local_10 = this;
  std::call_once<re2::Prog::first_byte()::__0>(&this->first_byte_once_,&local_18);
  return this->first_byte_;
}

Assistant:

int Prog::first_byte() {
  std::call_once(first_byte_once_, [this]() {
    first_byte_ = ComputeFirstByte();
  });
  return first_byte_;
}